

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O2

void __thiscall
ExprWriterTest_WritePiecewiseLinearExpr_Test::~ExprWriterTest_WritePiecewiseLinearExpr_Test
          (ExprWriterTest_WritePiecewiseLinearExpr_Test *this)

{
  ExprWriterTest::~ExprWriterTest(&this->super_ExprWriterTest);
  operator_delete(this,0x58);
  return;
}

Assistant:

TEST_F(ExprWriterTest, WritePiecewiseLinearExpr) {
  auto plterm = BeginPLTerm(2);
  plterm.AddSlope(-1);
  plterm.AddBreakpoint(5);
  plterm.AddSlope(0);
  plterm.AddBreakpoint(10);
  plterm.AddSlope(1);
  CHECK_WRITE("<<5, 10; -1, 0, 1>> x43", EndPLTerm(plterm, MakeVariable(42)));
}